

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O0

int main(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ostream *poVar9;
  char *pcVar10;
  undefined8 uVar11;
  runtime_error *prVar12;
  long lVar13;
  long lVar14;
  bool bVar15;
  __type _Var16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  char *isok;
  string s;
  double d_3;
  int p_1;
  double d;
  bool success;
  int p;
  bool is_pow_correct;
  int evl_method;
  bool success_1;
  char *start;
  int64_t exp_number;
  uchar digit_3;
  bool neg_exp;
  int digit_count;
  uchar digit_2;
  uchar digit_1;
  char *first_after_period;
  int64_t exponent_1;
  uchar digit;
  uint64_t i;
  char *start_digits;
  bool negative;
  bool found_minus;
  char *pinit;
  double d_4;
  uint64_t real_exponent_1;
  uint64_t mantissa_1;
  uint64_t upperbit_1;
  uint64_t product_middle_1;
  uint64_t product_high_1;
  uint64_t product_middle1_1;
  uint64_t product_middle2_1;
  uint64_t product_low_1;
  uint64_t factor_mantissa_low_1;
  uint64_t upper_1;
  uint64_t lower_1;
  value128 product_1;
  int lz_1;
  int64_t exponent_2;
  uint64_t factor_mantissa_1;
  double d_5;
  double d_1;
  uint64_t real_exponent;
  uint64_t mantissa;
  uint64_t upperbit;
  uint64_t product_middle;
  uint64_t product_high;
  uint64_t product_middle1;
  uint64_t product_middle2;
  uint64_t product_low;
  uint64_t factor_mantissa_low;
  uint64_t upper;
  uint64_t lower;
  value128 product;
  int lz;
  int64_t exponent;
  uint64_t factor_mantissa;
  double d_2;
  __uint128_t r_1;
  value128 answer_1;
  __uint128_t r;
  value128 answer;
  __uint128_t r_3;
  value128 answer_3;
  __uint128_t r_2;
  value128 answer_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb00;
  char *in_stack_fffffffffffffb08;
  undefined8 in_stack_fffffffffffffb10;
  undefined1 Assertion;
  bool local_4ba;
  undefined8 in_stack_fffffffffffffb48;
  double local_4b0;
  ulong local_4a0;
  double in_stack_fffffffffffffb70;
  string *in_stack_fffffffffffffb78;
  bool local_47a;
  string local_410 [32];
  string local_3f0 [32];
  double local_3d0;
  int local_3c4;
  double local_3c0;
  byte local_3b1;
  uint local_3b0;
  allocator local_3a9;
  string local_3a8 [39];
  allocator local_381;
  string local_380 [39];
  allocator local_359;
  string local_358 [39];
  allocator local_331;
  string local_330 [55];
  allocator local_2f9;
  string local_2f8 [35];
  undefined1 local_2d5;
  undefined4 local_2d4;
  undefined4 local_2d0;
  byte local_2c9;
  char *local_2c8;
  ulong local_2c0;
  byte local_2b2;
  byte local_2b1;
  int local_2b0;
  byte local_2aa;
  byte local_2a9;
  char *local_2a8;
  long local_2a0;
  byte local_291;
  ulong local_290;
  char *local_288;
  byte local_27a;
  undefined1 local_279;
  char *local_278;
  double *local_270;
  char *local_268;
  char *local_260;
  double local_258;
  ulong local_250;
  double local_248;
  ulong local_240;
  ulong local_238;
  ulong local_230;
  ulong local_228;
  long local_220;
  ulong local_218;
  undefined1 local_210 [16];
  ulong local_200;
  ulong local_1f8;
  ulong local_1f0;
  undefined1 local_1e8 [16];
  int local_1d4;
  long local_1d0;
  ulong local_1c8;
  double local_1c0;
  byte *local_1b8;
  byte local_1a9;
  ulong local_1a8;
  long local_1a0;
  double local_198;
  double local_190;
  ulong local_188;
  double local_180;
  ulong local_178;
  ulong local_170;
  ulong local_168;
  ulong local_160;
  long local_158;
  ulong local_150;
  undefined1 local_148 [16];
  ulong local_138;
  ulong local_130;
  ulong local_128;
  undefined1 local_120 [16];
  int local_10c;
  long local_108;
  ulong local_100;
  double local_f8;
  byte *local_f0;
  byte local_e1;
  ulong local_e0;
  long local_d8;
  double local_d0;
  undefined1 local_c8 [16];
  ulong local_b8;
  ulong local_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  ulong local_88;
  ulong local_80;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  ulong local_58;
  ulong local_50;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  ulong local_20;
  ulong local_18;
  undefined1 local_10 [16];
  
  Assertion = (undefined1)((ulong)in_stack_fffffffffffffb10 >> 0x38);
  local_2d0 = 0;
  local_2d4 = 0;
  printf("FLT_EVAL_METHOD = %d\n",0);
  _Var16 = std::pow<int,int>(0,0x10f70c);
  local_2d5 = _Var16 == 1e-308;
  if ((bool)local_2d5) {
    issue2093();
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2f8,"1090544144181609348835077142190",&local_2f9);
    basic_test_64bit(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
    Assert((bool)Assertion);
    std::__cxx11::string::~string(local_2f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_330,"4503599627370496.5",&local_331);
    basic_test_64bit(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
    Assert((bool)Assertion);
    std::__cxx11::string::~string(local_330);
    std::allocator<char>::~allocator((allocator<char> *)&local_331);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_358,"4503599627370497.5",&local_359);
    basic_test_64bit(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
    Assert((bool)Assertion);
    std::__cxx11::string::~string(local_358);
    std::allocator<char>::~allocator((allocator<char> *)&local_359);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_380,
               "0.000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000044501477170144022721148195934182639518696390927032912960468522194496444440421538910330590478162701758282983178260792422137401728773891892910553144148156412434867599762821265346585071045737627442980259622449029037796981144446145705102663115100318287949527959668236039986479250965780342141637013812613333119898765515451440315261253813266652951306000184917766328660755595837392240989947807556594098101021612198814605258742579179000071675999344145086087205681577915435923018910334964869420614052182892431445797605163650903606514140377217442262561590244668525767372446430075513332450079650686719491377688478005309963967709758965844137894433796621993967316936280457084866613206797017728916080020698679408551343728867675409720757232455434770912461317493580281734466552734375"
               ,&local_381);
    basic_test_64bit(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
    Assert((bool)Assertion);
    std::__cxx11::string::~string(local_380);
    std::allocator<char>::~allocator((allocator<char> *)&local_381);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_3a8,
               "0.000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000022250738585072008890245868760858598876504231122409594654935248025624400092282356951787758888037591552642309780950434312085877387158357291821993020294379224223559819827501242041788969571311791082261043971979604000454897391938079198936081525613113376149842043271751033627391549782731594143828136275113838604094249464942286316695429105080201815926642134996606517803095075913058719846423906068637102005108723282784678843631944515866135041223479014792369585208321597621066375401613736583044193603714778355306682834535634005074073040135602968046375918583163124224521599262546494300836851861719422417646455137135420132217031370496583210154654068035397417906022589503023501937519773030945763173210852507299305089761582519159720757232455434770912461317493580281734466552734375"
               ,&local_3a9);
    basic_test_64bit(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
    Assert((bool)Assertion);
    std::__cxx11::string::~string(local_3a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
    issue63();
    issue40();
    issue23();
    issue32();
    issue50_fastpath();
    issue50_off_fastpath();
    issue23_2();
    unit_tests();
    local_3b0 = 0xfffffece;
    while( true ) {
      if (0x134 < (int)local_3b0) break;
      if (local_3b0 == 0x17) {
        local_3b0 = 0x18;
      }
      printf(".");
      fflush((FILE *)0x0);
      local_d8 = (long)(int)local_3b0;
      local_e0 = 1;
      local_e1 = 0;
      local_f0 = &local_3b1;
      if ((local_d8 < -0x16) || (0x16 < local_d8)) {
        local_100 = *(ulong *)(fast_double_parser::compute_float_64(long,unsigned_long,bool,bool*)::
                               mantissa_64 + local_d8 * 8 + 0xa28);
        local_108 = (local_d8 * 0x3526a >> 0x10) + 0x43f;
        local_10c = fast_double_parser::leading_zeroes(1);
        local_e0 = local_e0 << ((byte)local_10c & 0x3f);
        local_88 = local_100;
        auVar1._8_8_ = 0;
        auVar1._0_8_ = local_e0;
        auVar5._8_8_ = 0;
        auVar5._0_8_ = local_100;
        local_98 = auVar1 * auVar5;
        local_128 = local_98._0_8_;
        local_130 = local_98._8_8_;
        local_120 = local_98;
        local_80 = local_e0;
        local_78 = local_98;
        if (((local_98._8_8_ & 0x1ff) == 0x1ff) &&
           (local_98._0_8_ + local_e0 < (ulong)local_98._0_8_)) {
          local_138 = *(ulong *)(fast_double_parser::compute_float_64(long,unsigned_long,bool,bool*)
                                 ::mantissa_128 + local_d8 * 8 + 0xa28);
          auVar2._8_8_ = 0;
          auVar2._0_8_ = local_e0;
          auVar6._8_8_ = 0;
          auVar6._0_8_ = local_138;
          local_c8 = auVar2 * auVar6;
          local_150 = local_c8._0_8_;
          local_158 = local_c8._8_8_;
          local_160 = local_98._0_8_;
          local_168 = local_98._8_8_;
          local_170 = local_98._0_8_ + local_c8._8_8_;
          if (local_170 < (ulong)local_98._0_8_) {
            local_168 = local_98._8_8_ + 1;
          }
          local_b8 = local_138;
          local_b0 = local_e0;
          local_a8 = local_c8;
          local_148 = local_c8;
          if (((local_170 == 0xffffffffffffffff) && ((local_168 & 0x1ff) == 0x1ff)) &&
             (local_c8._0_8_ + local_e0 < (ulong)local_c8._0_8_)) {
            local_120 = local_c8;
            *local_f0 = 0;
            local_d0 = 0.0;
            goto LAB_001102a3;
          }
          local_130 = local_168;
          local_128 = local_170;
          local_120 = local_c8;
        }
        local_178 = local_130 >> 0x3f;
        local_180 = (double)(local_130 >> 9 - (char)((long)local_130 >> 0x3f));
        local_10c = ((uint)(local_130 >> 0x3f) ^ 1) + local_10c;
        bVar15 = false;
        if ((local_128 == 0) && (bVar15 = false, (local_130 & 0x1ff) == 0)) {
          bVar15 = ((ulong)local_180 & 3) == 1;
        }
        if (bVar15) {
          *local_f0 = 0;
          local_d0 = 0.0;
        }
        else {
          local_180 = (double)(((ulong)local_180 & 1) + (long)local_180 >> 1);
          if (0x1fffffffffffff < (ulong)local_180) {
            local_180 = 0.0;
            local_10c = local_10c + -1;
          }
          local_180 = (double)((ulong)local_180 & 0xffefffffffffffff);
          local_188 = local_108 - local_10c;
          local_47a = local_188 == 0 || 0x7fe < local_188;
          if (local_47a) {
            *local_f0 = 0;
            local_d0 = 0.0;
          }
          else {
            local_190 = (double)((ulong)(local_e1 & 1) << 0x3f |
                                local_188 << 0x34 | (ulong)local_180);
            local_180 = local_190;
            *local_f0 = 1;
            local_d0 = local_190;
          }
        }
      }
      else {
        auVar17._0_12_ = ZEXT812(1);
        auVar17._12_4_ = 0x45300000;
        local_f8 = (auVar17._8_8_ - 1.9342813113834067e+25) + 1.0;
        if (local_d8 < 0) {
          local_f8 = local_f8 /
                     *(double *)
                      (fast_double_parser::compute_float_64(long,unsigned_long,bool,bool*)::
                       power_of_ten + local_d8 * -8);
        }
        else {
          local_f8 = local_f8 *
                     *(double *)
                      (fast_double_parser::compute_float_64(long,unsigned_long,bool,bool*)::
                       power_of_ten + local_d8 * 8);
        }
        local_3b1 = 1;
        local_d0 = local_f8;
      }
LAB_001102a3:
      local_3c0 = local_d0;
      if ((local_3b1 & 1) == 0) {
        printf("failed to parse\n");
        printf(" 10 ^ %d ",(ulong)local_3b0);
        return 1;
      }
      if ((local_d0 != testing_power_of_ten[(int)(local_3b0 + 0x133)]) ||
         (NAN(local_d0) || NAN(testing_power_of_ten[(int)(local_3b0 + 0x133)]))) {
        printf(" 10 ^ %d ",(ulong)local_3b0);
        printf("bad parsing\n");
        printf("got: %.*e\n",local_3c0,0x10);
        printf("reference: %.*e\n",testing_power_of_ten[(int)(local_3b0 + 0x133)],0x10);
        return 1;
      }
      local_3b0 = local_3b0 + 1;
    }
    for (local_3c4 = -0x132; local_3c4 < 0x135; local_3c4 = local_3c4 + 1) {
      std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffb48 >> 0x20));
      std::operator+(in_stack_fffffffffffffb08,in_stack_fffffffffffffb00);
      std::__cxx11::string::~string(local_410);
      poVar9 = std::operator<<((ostream *)&std::cout,"parsing ");
      poVar9 = std::operator<<(poVar9,local_3f0);
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      local_278 = (char *)std::__cxx11::string::c_str();
      local_270 = &local_3d0;
      local_279 = *local_278 == '-';
      local_27a = 0;
      local_268 = local_278;
      if ((bool)local_279) {
        local_268 = local_278 + 1;
        local_27a = 1;
        bVar15 = fast_double_parser::is_integer(*local_268);
        if (bVar15) goto LAB_001104fe;
        local_260 = (char *)0x0;
      }
      else {
LAB_001104fe:
        local_288 = local_268;
        if (*local_268 == '0') {
          local_268 = local_268 + 1;
          bVar15 = fast_double_parser::is_integer(*local_268);
          if (bVar15) {
            local_260 = (char *)0x0;
          }
          else {
            local_290 = 0;
LAB_00110627:
            local_2a0 = 0;
            local_2a8 = (char *)0x0;
            if (*local_268 == '.') {
              local_2a8 = local_268 + 1;
              local_268 = local_2a8;
              bVar15 = fast_double_parser::is_integer(*local_2a8);
              if (!bVar15) {
                local_260 = (char *)0x0;
                goto LAB_00111207;
              }
              local_2a9 = *local_268 - 0x30;
              local_290 = local_290 * 10 + (ulong)local_2a9;
              while( true ) {
                local_268 = local_268 + 1;
                bVar15 = fast_double_parser::is_integer(*local_268);
                if (!bVar15) break;
                local_2aa = *local_268 - 0x30;
                local_290 = local_290 * 10 + (ulong)local_2aa;
              }
              local_2a0 = (long)local_2a8 - (long)local_268;
            }
            local_2b0 = ((int)local_268 - (int)local_288) + -1;
            if ((*local_268 == 'e') || (*local_268 == 'E')) {
              pcVar10 = local_268 + 1;
              local_2b1 = 0;
              if (*pcVar10 == '-') {
                local_2b1 = 1;
                pcVar10 = local_268 + 2;
              }
              else if (*pcVar10 == '+') {
                pcVar10 = local_268 + 2;
              }
              local_268 = pcVar10;
              bVar15 = fast_double_parser::is_integer(*local_268);
              if (!bVar15) {
                local_260 = (char *)0x0;
                goto LAB_00111207;
              }
              local_2b2 = *local_268 - 0x30;
              local_2c0 = (ulong)local_2b2;
              local_268 = local_268 + 1;
              bVar15 = fast_double_parser::is_integer(*local_268);
              if (bVar15) {
                local_2b2 = *local_268 - 0x30;
                local_2c0 = local_2c0 * 10 + (ulong)local_2b2;
                local_268 = local_268 + 1;
              }
              bVar15 = fast_double_parser::is_integer(*local_268);
              if (bVar15) {
                local_2b2 = *local_268 - 0x30;
                local_2c0 = local_2c0 * 10 + (ulong)local_2b2;
                local_268 = local_268 + 1;
              }
              while( true ) {
                bVar15 = fast_double_parser::is_integer(*local_268);
                if (!bVar15) break;
                local_2b2 = *local_268 - 0x30;
                if ((long)local_2c0 < 0x100000000) {
                  local_2c0 = local_2c0 * 10 + (ulong)local_2b2;
                }
                local_268 = local_268 + 1;
              }
              if ((local_2b1 & 1) == 0) {
                local_4a0 = local_2c0;
              }
              else {
                local_4a0 = -local_2c0;
              }
              local_2a0 = local_4a0 + local_2a0;
            }
            if (0x12 < local_2b0) {
              local_2c8 = local_288;
              while( true ) {
                bVar15 = true;
                if (*local_2c8 != '0') {
                  bVar15 = *local_2c8 == '.';
                }
                if (!bVar15) break;
                local_2c8 = local_2c8 + 1;
              }
              local_2b0 = local_2b0 - ((int)local_2c8 - (int)local_288);
              if (0x12 < local_2b0) {
                local_260 = fast_double_parser::parse_float_strtod
                                      (in_stack_fffffffffffffb08,(double *)in_stack_fffffffffffffb00
                                      );
                goto LAB_00111207;
              }
            }
            if ((local_2a0 < -0x145) || (0x134 < local_2a0)) {
              local_260 = fast_double_parser::parse_float_strtod
                                    (in_stack_fffffffffffffb08,(double *)in_stack_fffffffffffffb00);
            }
            else {
              local_2c9 = 1;
              local_1a0 = local_2a0;
              local_1a8 = local_290;
              local_1a9 = local_27a & 1;
              local_1b8 = &local_2c9;
              if (((local_2a0 < -0x16) || (0x16 < local_2a0)) || (0x1fffffffffffff < local_290)) {
                if (local_290 == 0) {
                  in_stack_fffffffffffffb48 = 0;
                  local_4b0 = -0.0;
                  if (local_1a9 == 0) {
                    local_4b0 = 0.0;
                  }
                  local_198 = local_4b0;
                }
                else {
                  local_1c8 = *(ulong *)(fast_double_parser::
                                         compute_float_64(long,unsigned_long,bool,bool*)::
                                         mantissa_64 + local_2a0 * 8 + 0xa28);
                  local_1d0 = (local_2a0 * 0x3526a >> 0x10) + 0x43f;
                  local_1d4 = fast_double_parser::leading_zeroes(local_290);
                  local_1a8 = local_1a8 << ((byte)local_1d4 & 0x3f);
                  local_20 = local_1c8;
                  auVar3._8_8_ = 0;
                  auVar3._0_8_ = local_1a8;
                  auVar7._8_8_ = 0;
                  auVar7._0_8_ = local_1c8;
                  local_38 = auVar3 * auVar7;
                  local_1f0 = local_38._0_8_;
                  local_1f8 = local_38._8_8_;
                  local_1e8 = local_38;
                  local_18 = local_1a8;
                  local_10 = local_38;
                  if (((local_38._8_8_ & 0x1ff) == 0x1ff) &&
                     (local_38._0_8_ + local_1a8 < (ulong)local_38._0_8_)) {
                    local_200 = *(ulong *)(fast_double_parser::
                                           compute_float_64(long,unsigned_long,bool,bool*)::
                                           mantissa_128 + local_1a0 * 8 + 0xa28);
                    auVar4._8_8_ = 0;
                    auVar4._0_8_ = local_1a8;
                    auVar8._8_8_ = 0;
                    auVar8._0_8_ = local_200;
                    local_68 = auVar4 * auVar8;
                    local_218 = local_68._0_8_;
                    local_220 = local_68._8_8_;
                    local_228 = local_38._0_8_;
                    local_230 = local_38._8_8_;
                    local_238 = local_38._0_8_ + local_68._8_8_;
                    if (local_238 < (ulong)local_38._0_8_) {
                      local_230 = local_38._8_8_ + 1;
                    }
                    local_58 = local_200;
                    local_50 = local_1a8;
                    local_48 = local_68;
                    local_210 = local_68;
                    if (((local_238 == 0xffffffffffffffff) && ((local_230 & 0x1ff) == 0x1ff)) &&
                       (local_68._0_8_ + local_1a8 < (ulong)local_68._0_8_)) {
                      local_1e8 = local_68;
                      *local_1b8 = 0;
                      local_198 = 0.0;
                      goto LAB_001111ad;
                    }
                    local_1f8 = local_230;
                    local_1f0 = local_238;
                    local_1e8 = local_68;
                  }
                  local_240 = local_1f8 >> 0x3f;
                  local_248 = (double)(local_1f8 >> 9 - (char)((long)local_1f8 >> 0x3f));
                  local_1d4 = ((uint)(local_1f8 >> 0x3f) ^ 1) + local_1d4;
                  bVar15 = false;
                  if ((local_1f0 == 0) && (bVar15 = false, (local_1f8 & 0x1ff) == 0)) {
                    bVar15 = ((ulong)local_248 & 3) == 1;
                  }
                  if (bVar15) {
                    *local_1b8 = 0;
                    local_198 = 0.0;
                  }
                  else {
                    local_248 = (double)(((ulong)local_248 & 1) + (long)local_248 >> 1);
                    if (0x1fffffffffffff < (ulong)local_248) {
                      local_248 = 0.0;
                      local_1d4 = local_1d4 + -1;
                    }
                    local_248 = (double)((ulong)local_248 & 0xffefffffffffffff);
                    local_250 = local_1d0 - local_1d4;
                    local_4ba = local_250 == 0 || 0x7fe < local_250;
                    if (local_4ba) {
                      *local_1b8 = 0;
                      local_198 = 0.0;
                    }
                    else {
                      local_258 = (double)((ulong)(local_1a9 & 1) << 0x3f |
                                          local_250 << 0x34 | (ulong)local_248);
                      local_248 = local_258;
                      *local_1b8 = 1;
                      local_198 = local_258;
                    }
                  }
                }
              }
              else {
                auVar18._8_4_ = (int)(local_290 >> 0x20);
                auVar18._0_8_ = local_290;
                auVar18._12_4_ = 0x45300000;
                local_1c0 = (auVar18._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)local_290) - 4503599627370496.0);
                if (local_2a0 < 0) {
                  local_1c0 = local_1c0 /
                              *(double *)
                               (fast_double_parser::compute_float_64(long,unsigned_long,bool,bool*)
                                ::power_of_ten + local_2a0 * -8);
                }
                else {
                  local_1c0 = local_1c0 *
                              *(double *)
                               (fast_double_parser::compute_float_64(long,unsigned_long,bool,bool*)
                                ::power_of_ten + local_2a0 * 8);
                }
                if (local_1a9 != 0) {
                  local_1c0 = -local_1c0;
                }
                local_2c9 = 1;
                local_198 = local_1c0;
              }
LAB_001111ad:
              *local_270 = local_198;
              if ((local_2c9 & 1) == 0) {
                local_260 = fast_double_parser::parse_float_strtod
                                      (in_stack_fffffffffffffb08,(double *)in_stack_fffffffffffffb00
                                      );
              }
              else {
                local_260 = local_268;
              }
            }
          }
        }
        else {
          bVar15 = fast_double_parser::is_integer(*local_268);
          if (bVar15) {
            local_291 = *local_268 - 0x30;
            local_290 = (ulong)local_291;
            while( true ) {
              local_268 = local_268 + 1;
              bVar15 = fast_double_parser::is_integer(*local_268);
              if (!bVar15) break;
              local_291 = *local_268 - 0x30;
              local_290 = local_290 * 10 + (ulong)local_291;
            }
            goto LAB_00110627;
          }
          local_260 = (char *)0x0;
        }
      }
LAB_00111207:
      pcVar10 = local_260;
      if (local_260 == (char *)0x0) {
        uVar11 = std::__cxx11::string::c_str();
        printf("fast_double_parser refused to parse %s\n",uVar11);
        prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar12,"fast_double_parser refused to parse");
        __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      lVar13 = std::__cxx11::string::c_str();
      lVar14 = std::__cxx11::string::size();
      if (pcVar10 != (char *)(lVar13 + lVar14)) {
        prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar12,"does not point at the end");
        __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if ((local_3d0 != testing_power_of_ten[local_3c4 + 0x133]) ||
         (NAN(local_3d0) || NAN(testing_power_of_ten[local_3c4 + 0x133]))) {
        poVar9 = std::operator<<((ostream *)&std::cerr,"fast_double_parser disagrees");
        std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
        printf("fast_double_parser: %.*e\n",local_3d0,0x10);
        printf("reference: %.*e\n",testing_power_of_ten[(long)local_3c4 + 0x133],0x10);
        uVar11 = std::__cxx11::string::c_str();
        printf("string: %s\n",uVar11);
        prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar12,"fast_double_parser disagrees");
        __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::~string(local_3f0);
    }
    negative_subsubnormal_to_negative_zero();
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    poVar9 = std::operator<<((ostream *)&std::cout,"All ok");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    printf("Good!\n");
  }
  else {
    printf(
          "It appears that your system has bad floating-point support since 1e-308 differs from std::pow(10,-308).\n"
          );
    printf("Aborting further tests.");
  }
  return 0;
}

Assistant:

int main() {
  const int evl_method = FLT_EVAL_METHOD;
  printf("FLT_EVAL_METHOD = %d\n", evl_method);
  bool is_pow_correct{1e-308 == std::pow(10,-308)};
  if(!is_pow_correct) {
    printf("It appears that your system has bad floating-point support since 1e-308 differs from std::pow(10,-308).\n");
    printf("Aborting further tests.");
    return EXIT_SUCCESS;
  } 
  issue2093();
  Assert(basic_test_64bit("1090544144181609348835077142190",0x1.b8779f2474dfbp+99));
  Assert(basic_test_64bit("4503599627370496.5", 4503599627370496.5));
  Assert(basic_test_64bit("4503599627370497.5", 4503599627370497.5));
  Assert(basic_test_64bit("0.000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000044501477170144022721148195934182639518696390927032912960468522194496444440421538910330590478162701758282983178260792422137401728773891892910553144148156412434867599762821265346585071045737627442980259622449029037796981144446145705102663115100318287949527959668236039986479250965780342141637013812613333119898765515451440315261253813266652951306000184917766328660755595837392240989947807556594098101021612198814605258742579179000071675999344145086087205681577915435923018910334964869420614052182892431445797605163650903606514140377217442262561590244668525767372446430075513332450079650686719491377688478005309963967709758965844137894433796621993967316936280457084866613206797017728916080020698679408551343728867675409720757232455434770912461317493580281734466552734375", 0.000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000044501477170144022721148195934182639518696390927032912960468522194496444440421538910330590478162701758282983178260792422137401728773891892910553144148156412434867599762821265346585071045737627442980259622449029037796981144446145705102663115100318287949527959668236039986479250965780342141637013812613333119898765515451440315261253813266652951306000184917766328660755595837392240989947807556594098101021612198814605258742579179000071675999344145086087205681577915435923018910334964869420614052182892431445797605163650903606514140377217442262561590244668525767372446430075513332450079650686719491377688478005309963967709758965844137894433796621993967316936280457084866613206797017728916080020698679408551343728867675409720757232455434770912461317493580281734466552734375));
  Assert(basic_test_64bit("0.000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000022250738585072008890245868760858598876504231122409594654935248025624400092282356951787758888037591552642309780950434312085877387158357291821993020294379224223559819827501242041788969571311791082261043971979604000454897391938079198936081525613113376149842043271751033627391549782731594143828136275113838604094249464942286316695429105080201815926642134996606517803095075913058719846423906068637102005108723282784678843631944515866135041223479014792369585208321597621066375401613736583044193603714778355306682834535634005074073040135602968046375918583163124224521599262546494300836851861719422417646455137135420132217031370496583210154654068035397417906022589503023501937519773030945763173210852507299305089761582519159720757232455434770912461317493580281734466552734375", 0.000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000022250738585072008890245868760858598876504231122409594654935248025624400092282356951787758888037591552642309780950434312085877387158357291821993020294379224223559819827501242041788969571311791082261043971979604000454897391938079198936081525613113376149842043271751033627391549782731594143828136275113838604094249464942286316695429105080201815926642134996606517803095075913058719846423906068637102005108723282784678843631944515866135041223479014792369585208321597621066375401613736583044193603714778355306682834535634005074073040135602968046375918583163124224521599262546494300836851861719422417646455137135420132217031370496583210154654068035397417906022589503023501937519773030945763173210852507299305089761582519159720757232455434770912461317493580281734466552734375));
  issue63();
  issue40();
  issue23();
  issue32();
  issue50_fastpath();
  issue50_off_fastpath();
  issue23_2();
  unit_tests();
  for (int p = -306; p <= 308; p++) {
    if (p == 23)
      p++;
    printf(".");
    fflush(NULL);
    bool success;
    double d = fast_double_parser::compute_float_64(p, 1, false, &success);
    if (!success) {
      printf("failed to parse\n");
      printf(" 10 ^ %d ", p);

      return EXIT_FAILURE;
    }
    if (d != testing_power_of_ten[p + 307]) {
      printf(" 10 ^ %d ", p);

      printf("bad parsing\n");
      printf("got: %.*e\n", DBL_DIG + 1, d);
      printf("reference: %.*e\n", DBL_DIG + 1, testing_power_of_ten[p + 307]);

      return EXIT_FAILURE;
    }
  }
  for (int p = -306; p <= 308; p++) {
    double d;
    std::string s = "1e"+std::to_string(p);
    std::cout << "parsing " << s << std::endl;
    const char * isok = fast_double_parser::parse_number(s.c_str(), &d);
    if (!isok) {
      printf("fast_double_parser refused to parse %s\n", s.c_str());
      throw std::runtime_error("fast_double_parser refused to parse");
    }
    if(isok != s.c_str() + s.size()) throw std::runtime_error("does not point at the end");
    if (d != testing_power_of_ten[p + 307]) {
      std::cerr << "fast_double_parser disagrees" << std::endl;
      printf("fast_double_parser: %.*e\n", DBL_DIG + 1, d);
      printf("reference: %.*e\n", DBL_DIG + 1, testing_power_of_ten[p + 307]);
      printf("string: %s\n", s.c_str());
      throw std::runtime_error("fast_double_parser disagrees");
    }
  }
  negative_subsubnormal_to_negative_zero();
  std::cout << std::endl;
  std::cout << "All ok" << std::endl;
  printf("Good!\n");
  return EXIT_SUCCESS;
}